

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createMemTransfer(LLVMPointerGraphBuilder *this,IntrinsicInst *I)

{
  uint uVar1;
  Value *val;
  Value *val_00;
  int iVar2;
  PSNode *pPVar3;
  raw_ostream *prVar4;
  long lVar5;
  undefined8 *puVar6;
  unsigned_long *puVar7;
  PSNode *srcNode;
  PSNode *destNode;
  PSNode *local_40;
  PSNode *local_38;
  unsigned_long local_30;
  
  lVar5 = 0;
  if (*(long *)(*(long *)&I[-1].field_0x30 + 0x18) == *(long *)&I->field_0x48) {
    lVar5 = *(long *)&I[-1].field_0x30;
  }
  if ((*(int *)(lVar5 + 0x24) != 0xc2) && (*(int *)(lVar5 + 0x24) != 0xbf)) {
    prVar4 = (raw_ostream *)llvm::errs();
    prVar4 = llvm::raw_ostream::operator<<(prVar4,"ERR: unhandled mem transfer intrinsic");
    prVar4 = llvm::operator<<(prVar4,(Value *)I);
    llvm::raw_ostream::operator<<(prVar4,"\n");
    abort();
  }
  puVar6 = (undefined8 *)((long)I - (ulong)(uint)(*(int *)&I->field_0x14 << 5));
  val = (Value *)*puVar6;
  val_00 = (Value *)puVar6[4];
  lVar5 = puVar6[8];
  local_30 = Offset::UNKNOWN;
  if ((lVar5 != 0) && (*(char *)(lVar5 + 0x10) == '\x10')) {
    uVar1 = *(uint *)(lVar5 + 0x20);
    puVar7 = (unsigned_long *)(lVar5 + 0x18);
    if (0x40 < uVar1) {
      iVar2 = llvm::APInt::countLeadingZerosSlowCase();
      local_30 = 0xffffffffffffffff;
      if (0x40 < uVar1 - iVar2) goto LAB_00121672;
    }
    if (0x40 < uVar1) {
      puVar7 = (unsigned_long *)*puVar7;
    }
    local_30 = *puVar7;
  }
LAB_00121672:
  local_38 = getOperand(this,val);
  local_40 = getOperand(this,val_00);
  pPVar3 = PointerGraph::
           create<(dg::pta::PSNodeType)20,dg::pta::PSNode*&,dg::pta::PSNode*&,unsigned_long&>
                     ((PointerGraph *)this,&local_40,&local_38,&local_30);
  return pPVar3;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createMemTransfer(const llvm::IntrinsicInst *I) {
    using namespace llvm;
    const Value *dest, *src; //, *lenVal;
    uint64_t lenVal = Offset::UNKNOWN;

    switch (I->getIntrinsicID()) {
    case Intrinsic::memmove:
    case Intrinsic::memcpy:
        dest = I->getOperand(0);
        src = I->getOperand(1);
        lenVal = llvmutils::getConstantValue(I->getOperand(2));
        break;
    default:
        errs() << "ERR: unhandled mem transfer intrinsic" << *I << "\n";
        abort();
    }

    PSNode *destNode = getOperand(dest);
    PSNode *srcNode = getOperand(src);
    PSNode *node = PS.create<PSNodeType::MEMCPY>(srcNode, destNode, lenVal);

    return node;
}